

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureGatherTests.cpp
# Opt level: O0

string * __thiscall
deqp::gles31::Functional::anon_unknown_0::TextureGatherCase::genGatherFuncCall
          (string *__return_storage_ptr__,TextureGatherCase *this,GatherType gatherType,
          TextureFormat *textureFormat,GatherArgs *gatherArgs,string *refZExpr,IVec2 *offsetRange,
          int indentationDepth)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  Vector<int,_2> *value;
  Vector<int,_2> *value_00;
  Vector<int,_2> *value_01;
  Vector<int,_2> *value_02;
  Vector<int,_2> *value_03;
  string local_528;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_508;
  allocator<char> local_4e1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e0;
  string local_4c0;
  allocator<char> local_499;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_498;
  string local_478;
  allocator<char> local_451;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_450;
  string local_430;
  allocator<char> local_409;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_408;
  string local_3e8;
  allocator<char> local_3c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_380;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  int local_15c;
  string local_158;
  int local_134;
  string local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined1 local_39;
  string *local_38;
  string *refZExpr_local;
  GatherArgs *gatherArgs_local;
  TextureFormat *textureFormat_local;
  TextureGatherCase *pTStack_18;
  GatherType gatherType_local;
  TextureGatherCase *this_local;
  string *result;
  
  local_39 = 0;
  local_38 = refZExpr;
  refZExpr_local = (string *)gatherArgs;
  gatherArgs_local = (GatherArgs *)textureFormat;
  textureFormat_local._4_4_ = gatherType;
  pTStack_18 = this;
  this_local = (TextureGatherCase *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  if (textureFormat_local._4_4_ == GATHERTYPE_BASIC) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"textureGather");
  }
  else if (textureFormat_local._4_4_ - GATHERTYPE_OFFSET < 2) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"textureGatherOffset");
  }
  else if (textureFormat_local._4_4_ == GATHERTYPE_OFFSETS) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"textureGatherOffsets");
  }
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"(u_sampler, v_texCoord");
  bVar1 = isDepthFormat((TextureFormat *)gatherArgs_local);
  if (bVar1) {
    std::operator+(&local_70,", ",local_38);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_70);
  }
  if (((textureFormat_local._4_4_ == GATHERTYPE_OFFSET) ||
      (textureFormat_local._4_4_ == GATHERTYPE_OFFSET_DYNAMIC)) ||
     (textureFormat_local._4_4_ == GATHERTYPE_OFFSETS)) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,", ");
    if (textureFormat_local._4_4_ == GATHERTYPE_OFFSET) {
      de::toString<tcu::Vector<int,2>>(&local_b0,(de *)&refZExpr_local->field_0x4,value);
      std::operator+(&local_90,"ivec2",&local_b0);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_b0);
    }
    else if (textureFormat_local._4_4_ == GATHERTYPE_OFFSET_DYNAMIC) {
      iVar2 = tcu::Vector<int,_2>::y(offsetRange);
      iVar3 = tcu::Vector<int,_2>::x(offsetRange);
      local_134 = (iVar2 - iVar3) + 1;
      de::toString<int>(&local_130,&local_134);
      std::operator+(&local_110,"pixCoord.yx % ivec2(",&local_130);
      std::operator+(&local_f0,&local_110,") + ");
      local_15c = tcu::Vector<int,_2>::x(offsetRange);
      de::toString<int>(&local_158,&local_15c);
      std::operator+(&local_d0,&local_f0,&local_158);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_158);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_130);
    }
    else if (textureFormat_local._4_4_ == GATHERTYPE_OFFSETS) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3c0,(long)indentationDepth,'\t',&local_3c1);
      std::operator+(&local_3a0,"ivec2[4](\n",&local_3c0);
      std::operator+(&local_380,&local_3a0,"\tivec2");
      de::toString<tcu::Vector<int,2>>(&local_3e8,(de *)&refZExpr_local->field_0x4,value_00);
      std::operator+(&local_360,&local_380,&local_3e8);
      std::operator+(&local_340,&local_360,",\n");
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_408,(long)indentationDepth,'\t',&local_409);
      std::operator+(&local_320,&local_340,&local_408);
      std::operator+(&local_300,&local_320,"\tivec2");
      de::toString<tcu::Vector<int,2>>
                (&local_430,(de *)((long)&refZExpr_local->_M_string_length + 4),value_01);
      std::operator+(&local_2e0,&local_300,&local_430);
      std::operator+(&local_2c0,&local_2e0,",\n");
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_450,(long)indentationDepth,'\t',&local_451);
      std::operator+(&local_2a0,&local_2c0,&local_450);
      std::operator+(&local_280,&local_2a0,"\tivec2");
      de::toString<tcu::Vector<int,2>>
                (&local_478,(de *)((refZExpr_local->field_2)._M_local_buf + 4),value_02);
      std::operator+(&local_260,&local_280,&local_478);
      std::operator+(&local_240,&local_260,",\n");
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_498,(long)indentationDepth,'\t',&local_499);
      std::operator+(&local_220,&local_240,&local_498);
      std::operator+(&local_200,&local_220,"\tivec2");
      de::toString<tcu::Vector<int,2>>
                (&local_4c0,(de *)((refZExpr_local->field_2)._M_local_buf + 0xc),value_03);
      std::operator+(&local_1e0,&local_200,&local_4c0);
      std::operator+(&local_1c0,&local_1e0,")\n");
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4e0,(long)indentationDepth,'\t',&local_4e1);
      std::operator+(&local_1a0,&local_1c0,&local_4e0);
      std::operator+(&local_180,&local_1a0,"\t");
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_180);
      std::__cxx11::string::~string((string *)&local_180);
      std::__cxx11::string::~string((string *)&local_1a0);
      std::__cxx11::string::~string((string *)&local_4e0);
      std::allocator<char>::~allocator(&local_4e1);
      std::__cxx11::string::~string((string *)&local_1c0);
      std::__cxx11::string::~string((string *)&local_1e0);
      std::__cxx11::string::~string((string *)&local_4c0);
      std::__cxx11::string::~string((string *)&local_200);
      std::__cxx11::string::~string((string *)&local_220);
      std::__cxx11::string::~string((string *)&local_498);
      std::allocator<char>::~allocator(&local_499);
      std::__cxx11::string::~string((string *)&local_240);
      std::__cxx11::string::~string((string *)&local_260);
      std::__cxx11::string::~string((string *)&local_478);
      std::__cxx11::string::~string((string *)&local_280);
      std::__cxx11::string::~string((string *)&local_2a0);
      std::__cxx11::string::~string((string *)&local_450);
      std::allocator<char>::~allocator(&local_451);
      std::__cxx11::string::~string((string *)&local_2c0);
      std::__cxx11::string::~string((string *)&local_2e0);
      std::__cxx11::string::~string((string *)&local_430);
      std::__cxx11::string::~string((string *)&local_300);
      std::__cxx11::string::~string((string *)&local_320);
      std::__cxx11::string::~string((string *)&local_408);
      std::allocator<char>::~allocator(&local_409);
      std::__cxx11::string::~string((string *)&local_340);
      std::__cxx11::string::~string((string *)&local_360);
      std::__cxx11::string::~string((string *)&local_3e8);
      std::__cxx11::string::~string((string *)&local_380);
      std::__cxx11::string::~string((string *)&local_3a0);
      std::__cxx11::string::~string((string *)&local_3c0);
      std::allocator<char>::~allocator(&local_3c1);
    }
  }
  if (-1 < *(int *)refZExpr_local) {
    de::toString<int>(&local_528,(int *)refZExpr_local);
    std::operator+(&local_508,", ",&local_528);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_508);
    std::__cxx11::string::~string((string *)&local_508);
    std::__cxx11::string::~string((string *)&local_528);
  }
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,")");
  return __return_storage_ptr__;
}

Assistant:

string TextureGatherCase::genGatherFuncCall (GatherType gatherType, const tcu::TextureFormat& textureFormat, const GatherArgs& gatherArgs, const string& refZExpr, const IVec2& offsetRange, int indentationDepth)
{
	string result;

	switch (gatherType)
	{
		case GATHERTYPE_BASIC:
			result += "textureGather";
			break;
		case GATHERTYPE_OFFSET: // \note Fallthrough.
		case GATHERTYPE_OFFSET_DYNAMIC:
			result += "textureGatherOffset";
			break;
		case GATHERTYPE_OFFSETS:
			result += "textureGatherOffsets";
			break;
		default:
			DE_ASSERT(false);
	}

	result += "(u_sampler, v_texCoord";

	if (isDepthFormat(textureFormat))
	{
		DE_ASSERT(gatherArgs.componentNdx < 0);
		result += ", " + refZExpr;
	}

	if (gatherType == GATHERTYPE_OFFSET ||
		gatherType == GATHERTYPE_OFFSET_DYNAMIC ||
		gatherType == GATHERTYPE_OFFSETS)
	{
		result += ", ";
		switch (gatherType)
		{
			case GATHERTYPE_OFFSET:
				result += "ivec2" + de::toString(gatherArgs.offsets[0]);
				break;

			case GATHERTYPE_OFFSET_DYNAMIC:
				result += "pixCoord.yx % ivec2(" + de::toString(offsetRange.y() - offsetRange.x() + 1) + ") + " + de::toString(offsetRange.x());
				break;

			case GATHERTYPE_OFFSETS:
				result += "ivec2[4](\n"
						  + string(indentationDepth, '\t') + "\tivec2" + de::toString(gatherArgs.offsets[0]) + ",\n"
						  + string(indentationDepth, '\t') + "\tivec2" + de::toString(gatherArgs.offsets[1]) + ",\n"
						  + string(indentationDepth, '\t') + "\tivec2" + de::toString(gatherArgs.offsets[2]) + ",\n"
						  + string(indentationDepth, '\t') + "\tivec2" + de::toString(gatherArgs.offsets[3]) + ")\n"
						  + string(indentationDepth, '\t') + "\t";
				break;

			default:
				DE_ASSERT(false);
		}
	}

	if (gatherArgs.componentNdx >= 0)
	{
		DE_ASSERT(gatherArgs.componentNdx < 4);
		result += ", " + de::toString(gatherArgs.componentNdx);
	}

	result += ")";

	return result;
}